

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_rangeproof_info
              (secp256k1_context *ctx,int *exp,int *mantissa,uint64_t *min_value,uint64_t *max_value
              ,uchar *proof,size_t plen)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  uint64_t uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  if (proof == (uchar *)0x0) {
    secp256k1_rangeproof_info_cold_1();
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if ((0x40 < plen) && (bVar1 = *proof, iVar3 = 0, -1 < (char)bVar1)) {
      *exp = -1;
      *mantissa = 0;
      iVar3 = 0;
      if (bVar1 < 0x40) {
        lVar4 = 1;
        uVar8 = 0;
      }
      else {
        bVar2 = *proof;
        *exp = bVar2 & 0x1f;
        if (0x12 < (byte)(bVar2 & 0x1f)) {
          return 0;
        }
        bVar2 = proof[1];
        *mantissa = bVar2 + 1;
        if (0x3f < bVar2) {
          return 0;
        }
        uVar8 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
        lVar4 = 2;
      }
      *max_value = uVar8;
      iVar6 = *exp;
      if (0 < iVar6) {
        uVar8 = *max_value;
        do {
          if (0x1999999999999999 < uVar8) {
            return 0;
          }
          uVar8 = uVar8 * 10;
          *max_value = uVar8;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      *min_value = 0;
      if ((bVar1 & 0x20) != 0) {
        if (plen - lVar4 < 8) {
          return 0;
        }
        uVar5 = *min_value;
        lVar7 = 0;
        do {
          uVar5 = uVar5 << 8 | (ulong)proof[lVar7 + lVar4];
          *min_value = uVar5;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
      }
      if (!CARRY8(*max_value,*min_value)) {
        *max_value = *max_value + *min_value;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int secp256k1_rangeproof_info(const secp256k1_context* ctx, int *exp, int *mantissa,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    size_t offset;
    uint64_t scale;
    ARG_CHECK(exp != NULL);
    ARG_CHECK(mantissa != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(proof != NULL);
    offset = 0;
    scale = 1;
    (void)ctx;
    return secp256k1_rangeproof_getheader_impl(&offset, exp, mantissa, &scale, min_value, max_value, proof, plen);
}